

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::doctypePI(AbstractDOMParser *this,XMLCh *target,XMLCh *data)

{
  XMLBuffer *pXVar1;
  XMLSize_t XVar2;
  bool bVar3;
  
  bVar3 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar3) {
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'<';
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'?';
    XMLBuffer::append(this->fInternalSubset,target);
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L' ';
    XMLBuffer::append(this->fInternalSubset,data);
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'?';
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::doctypePI
(
    const   XMLCh* const    target
    , const XMLCh* const    data
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        //add these chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(target);
        fInternalSubset.append(chSpace);
        fInternalSubset.append(data);
        fInternalSubset.append(chQuestion);
        fInternalSubset.append(chCloseAngle);
    }
}